

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

string * __thiscall
flow::HandlerCallInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,HandlerCallInstr *this)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"handler",&local_39);
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string HandlerCallInstr::to_string() const {
  return formatOne("handler");
}